

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O1

_Bool xor16_populate(uint64_t *keys,uint32_t size,xor16_t *filter)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint16_t *puVar5;
  size_t __size;
  uint uVar6;
  long lVar7;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  _Bool _Var14;
  int iVar15;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ushort *puVar24;
  undefined4 *puVar25;
  uint32_t r0;
  ulong local_c8;
  ulong local_88;
  int iVar16;
  
  if (size == 0) {
    _Var14 = false;
  }
  else {
    local_c8 = (ulong)size;
    filter->seed = 0x910a2dec89025cc1;
    uVar3 = filter->blockLength;
    lVar7 = uVar3 * 0x10;
    __size = uVar3 * 0x30;
    __s = malloc(__size);
    __ptr = malloc(__size);
    __ptr_00 = malloc(local_c8 << 4);
    iVar16 = 0;
    if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
      lVar8 = uVar3 * 0x20;
      local_88 = 0x9e3779b97f4a7c16;
      while( true ) {
        if (iVar16 + 1 == 10) {
          local_c8 = xor_sort_and_remove_dup(keys,local_c8 & 0xffffffff);
        }
        if (iVar16 == 100) {
          iVar16 = 0;
          goto LAB_00103c86;
        }
        memset(__s,0,__size);
        uVar10 = local_c8 & 0xffffffff;
        if ((int)local_c8 != 0) {
          uVar4 = filter->seed;
          uVar12 = (ulong)(uint)filter->blockLength;
          uVar17 = 0;
          do {
            uVar9 = keys[uVar17] + uVar4;
            uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0xae502812aa7333;
            uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0x3b314601e57a13ad;
            uVar20 = uVar9 >> 0x21 ^ uVar9;
            uVar23 = (uVar20 & 0xffffffff) * uVar12 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar23);
            *puVar1 = *puVar1 ^ uVar20;
            piVar18 = (int *)((long)__s + uVar23 + 8);
            *piVar18 = *piVar18 + 1;
            uVar9 = ((uint)(uVar20 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar12 >> 0x1c &
                    0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar9 + lVar7);
            *puVar1 = *puVar1 ^ uVar20;
            piVar18 = (int *)((long)__s + uVar9 + lVar7 + 8);
            *piVar18 = *piVar18 + 1;
            uVar9 = (uVar20 >> 0x16 & 0xffffffff) * uVar12 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar9 + lVar8);
            *puVar1 = *puVar1 ^ uVar20;
            piVar18 = (int *)((long)__s + uVar9 + lVar8 + 8);
            *piVar18 = *piVar18 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
        uVar12 = filter->blockLength;
        if (uVar12 == 0) {
          lVar13 = 0;
        }
        else {
          lVar13 = 0;
          uVar17 = 0;
          piVar18 = (int *)((long)__s + 8);
          do {
            if (*piVar18 == 1) {
              *(int *)((long)__ptr + lVar13 * 0x10 + 8) = (int)uVar17;
              *(undefined8 *)((long)__ptr + lVar13 * 0x10) = *(undefined8 *)(piVar18 + -2);
              lVar13 = lVar13 + 1;
            }
            uVar17 = uVar17 + 1;
            piVar18 = piVar18 + 4;
          } while (uVar12 != uVar17);
        }
        if (uVar12 == 0) {
          lVar19 = 0;
        }
        else {
          lVar19 = 0;
          uVar17 = 0;
          piVar18 = (int *)((long)__s + lVar7 + 8);
          do {
            if (*piVar18 == 1) {
              *(int *)((long)__ptr + lVar19 * 0x10 + lVar7 + 8) = (int)uVar17;
              *(undefined8 *)((long)__ptr + lVar19 * 0x10 + lVar7) = *(undefined8 *)(piVar18 + -2);
              lVar19 = lVar19 + 1;
            }
            uVar17 = uVar17 + 1;
            piVar18 = piVar18 + 4;
          } while (uVar12 != uVar17);
        }
        if (uVar12 == 0) {
          lVar21 = 0;
        }
        else {
          lVar21 = 0;
          uVar17 = 0;
          piVar18 = (int *)((long)__s + lVar8 + 8);
          do {
            if (*piVar18 == 1) {
              *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)uVar17;
              *(undefined8 *)((long)__ptr + lVar21 * 0x10 + lVar8) = *(undefined8 *)(piVar18 + -2);
              lVar21 = lVar21 + 1;
            }
            uVar17 = uVar17 + 1;
            piVar18 = piVar18 + 4;
          } while (uVar12 != uVar17);
        }
        if (lVar13 + lVar19 + lVar21 == 0) {
          uVar9 = 0;
        }
        else {
          uVar17 = uVar12 & 0xffffffff;
          uVar9 = 0;
          do {
            if (lVar13 != 0) {
              puVar25 = (undefined4 *)((long)__ptr + lVar13 * 0x10 + -4);
              do {
                uVar6 = puVar25[-1];
                if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + 8) != 0) {
                  uVar20 = *(ulong *)(puVar25 + -3);
                  uVar2 = *puVar25;
                  uVar23 = ((uint)(uVar20 << 0x15) | (uint)(uVar20 >> 0x2b)) * uVar17;
                  lVar22 = uVar9 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar22) = uVar20;
                  *(uint *)((long)__ptr_00 + lVar22 + 8) = uVar6;
                  *(undefined4 *)((long)__ptr_00 + lVar22 + 0xc) = uVar2;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar11 = *(ulong *)((long)__s + lVar22 + lVar7) ^ uVar20;
                  *(ulong *)((long)__s + lVar22 + lVar7) = uVar11;
                  iVar15 = *(int *)((long)__s + lVar22 + lVar7 + 8) + -1;
                  *(int *)((long)__s + lVar22 + lVar7 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar19 * 0x10 + lVar7 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar19 * 0x10 + lVar7) = uVar11;
                    lVar19 = lVar19 + 1;
                  }
                  uVar23 = (uVar20 >> 0x16 & 0xffffffff) * uVar17;
                  uVar9 = uVar9 + 1;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar20 = uVar20 ^ *(ulong *)((long)__s + lVar22 + lVar8);
                  *(ulong *)((long)__s + lVar22 + lVar8) = uVar20;
                  iVar15 = *(int *)((long)__s + lVar22 + lVar8 + 8) + -1;
                  *(int *)((long)__s + lVar22 + lVar8 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar21 * 0x10 + lVar8) = uVar20;
                    lVar21 = lVar21 + 1;
                  }
                }
                lVar13 = lVar13 + -1;
                puVar25 = puVar25 + -4;
              } while (lVar13 != 0);
            }
            if (lVar19 == 0) {
              lVar13 = 0;
            }
            else {
              puVar25 = (undefined4 *)((long)__ptr + lVar19 * 0x10 + lVar7 + -4);
              lVar13 = 0;
              do {
                uVar6 = puVar25[-1];
                if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + lVar7 + 8) != 0) {
                  uVar20 = *(ulong *)(puVar25 + -3);
                  uVar2 = *puVar25;
                  uVar23 = (uVar20 & 0xffffffff) * uVar17;
                  lVar22 = uVar9 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar22) = uVar20;
                  *(uint *)((long)__ptr_00 + lVar22 + 8) = uVar6 + (int)uVar3;
                  *(undefined4 *)((long)__ptr_00 + lVar22 + 0xc) = uVar2;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar11 = *(ulong *)((long)__s + lVar22) ^ uVar20;
                  *(ulong *)((long)__s + lVar22) = uVar11;
                  iVar15 = *(int *)((long)__s + lVar22 + 8) + -1;
                  *(int *)((long)__s + lVar22 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar13 * 0x10 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar13 * 0x10) = uVar11;
                    lVar13 = lVar13 + 1;
                  }
                  uVar23 = (uVar20 >> 0x16 & 0xffffffff) * uVar17;
                  uVar9 = uVar9 + 1;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar20 = uVar20 ^ *(ulong *)((long)__s + lVar22 + lVar8);
                  *(ulong *)((long)__s + lVar22 + lVar8) = uVar20;
                  iVar15 = *(int *)((long)__s + lVar22 + lVar8 + 8) + -1;
                  *(int *)((long)__s + lVar22 + lVar8 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar21 * 0x10 + lVar8) = uVar20;
                    lVar21 = lVar21 + 1;
                  }
                }
                lVar19 = lVar19 + -1;
                puVar25 = puVar25 + -4;
              } while (lVar19 != 0);
            }
            if (lVar21 == 0) {
              lVar19 = 0;
            }
            else {
              puVar25 = (undefined4 *)((long)__ptr + lVar21 * 0x10 + lVar8 + -4);
              lVar19 = 0;
              do {
                uVar6 = puVar25[-1];
                if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + lVar8 + 8) != 0) {
                  uVar20 = *(ulong *)(puVar25 + -3);
                  uVar2 = *puVar25;
                  uVar23 = (uVar20 & 0xffffffff) * uVar17;
                  lVar22 = uVar9 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar22) = uVar20;
                  *(uint *)((long)__ptr_00 + lVar22 + 8) = uVar6 + (int)uVar3 * 2;
                  *(undefined4 *)((long)__ptr_00 + lVar22 + 0xc) = uVar2;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar11 = *(ulong *)((long)__s + lVar22) ^ uVar20;
                  *(ulong *)((long)__s + lVar22) = uVar11;
                  iVar15 = *(int *)((long)__s + lVar22 + 8) + -1;
                  *(int *)((long)__s + lVar22 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar13 * 0x10 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar13 * 0x10) = uVar11;
                    lVar13 = lVar13 + 1;
                  }
                  uVar23 = ((uint)(uVar20 << 0x15) | (uint)(uVar20 >> 0x2b)) * uVar17;
                  uVar9 = uVar9 + 1;
                  lVar22 = (uVar23 >> 0x20) * 0x10;
                  uVar20 = uVar20 ^ *(ulong *)((long)__s + lVar22 + lVar7);
                  *(ulong *)((long)__s + lVar22 + lVar7) = uVar20;
                  iVar15 = *(int *)((long)__s + lVar22 + lVar7 + 8) + -1;
                  *(int *)((long)__s + lVar22 + lVar7 + 8) = iVar15;
                  if (iVar15 == 1) {
                    *(int *)((long)__ptr + lVar19 * 0x10 + lVar7 + 8) = (int)(uVar23 >> 0x20);
                    *(ulong *)((long)__ptr + lVar19 * 0x10 + lVar7) = uVar20;
                    lVar19 = lVar19 + 1;
                  }
                }
                lVar21 = lVar21 + -1;
                puVar25 = puVar25 + -4;
              } while (lVar21 != 0);
            }
            lVar21 = 0;
          } while (lVar13 + lVar19 != 0);
        }
        if (uVar9 == uVar10) break;
        local_88 = local_88 + 0x9e3779b97f4a7c15;
        uVar10 = (local_88 >> 0x1e ^ local_88) * -0x40a7b892e31b1a47;
        uVar10 = (uVar10 >> 0x1b ^ uVar10) * -0x6b2fb644ecceee15;
        filter->seed = uVar10 >> 0x1f ^ uVar10;
        iVar16 = iVar16 + 1;
      }
      iVar16 = 1;
      if ((int)local_c8 != 0) {
        puVar5 = filter->fingerprints;
        uVar12 = uVar12 & 0xffffffff;
        lVar7 = uVar10 << 4;
        do {
          uVar10 = *(ulong *)((long)__ptr_00 + lVar7 + -0x10);
          uVar17 = (ulong)*(uint *)((long)__ptr_00 + lVar7 + -8);
          uVar6 = (uint)(uVar10 >> 0x20);
          if (uVar17 < uVar3) {
            puVar24 = puVar5 + uVar3 + (((uint)(uVar10 << 0x15) | uVar6 >> 0xb) * uVar12 >> 0x20);
LAB_00103c2f:
            uVar6 = (uint)(uVar10 >> 0x16);
            uVar9 = uVar3 * 2;
          }
          else {
            puVar24 = puVar5 + ((uVar10 & 0xffffffff) * uVar12 >> 0x20);
            if (uVar17 < uVar3 * 2) goto LAB_00103c2f;
            uVar6 = (uint)(uVar10 << 0x15) | uVar6 >> 0xb;
            uVar9 = uVar3;
          }
          puVar5[uVar17] =
               (ushort)(uVar10 >> 0x20) ^ (ushort)uVar10 ^
               puVar5[uVar9 + (uVar6 * uVar12 >> 0x20)] ^ *puVar24;
          lVar7 = lVar7 + -0x10;
        } while (lVar7 != 0);
        iVar16 = 1;
      }
    }
LAB_00103c86:
    _Var14 = SUB41(iVar16,0);
    free(__s);
    free(__ptr);
    free(__ptr_00);
  }
  return _Var14;
}

Assistant:

static inline bool xor16_populate(uint64_t *keys, uint32_t size, xor16_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;

  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor16_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor16_get_h1(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h1 = xor16_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint16_t * fingerprints0 = filter->fingerprints;
  uint16_t * fingerprints1 = filter->fingerprints + blockLength;
  uint16_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor16_get_h1(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints1[xor16_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint16_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}